

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O2

bool pdqsort_detail::
     partial_insertion_sort<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::cliquePartition(std::vector<double,std::allocator<double>>const&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,std::vector<int,std::allocator<int>>&)::__0>
               (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                begin,__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                      end,anon_class_8_1_bccf3fd9 comp)

{
  CliqueVar v1;
  long lVar1;
  CliqueVar *pCVar2;
  bool bVar3;
  CliqueVar *pCVar4;
  CliqueVar *pCVar5;
  CliqueVar v2;
  long lVar6;
  bool bVar7;
  anon_class_8_1_bccf3fd9 local_50;
  CliqueVar *local_48;
  ulong local_40;
  CliqueVar *local_38;
  
  if (begin._M_current == end._M_current) {
LAB_0027dc5c:
    bVar7 = true;
  }
  else {
    local_40 = 0;
    local_50.objective = comp.objective;
    local_38 = begin._M_current;
    do {
      lVar1 = -(long)begin._M_current;
      pCVar4 = begin._M_current;
      do {
        lVar6 = lVar1;
        begin._M_current = pCVar4 + 1;
        bVar7 = begin._M_current == end._M_current;
        if (bVar7) goto LAB_0027dc5c;
        v2 = *pCVar4;
        v1 = *begin._M_current;
        bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                          (&local_50,v1,v2);
        pCVar4 = begin._M_current;
        lVar1 = lVar6 + -4;
        pCVar2 = end._M_current;
      } while (!bVar3);
      do {
        local_48 = pCVar2;
        pCVar2 = pCVar4 + -1;
        *pCVar4 = v2;
        pCVar5 = local_38;
        if (pCVar2 == local_38) break;
        v2 = pCVar4[-2];
        bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                          (&local_50,v1,v2);
        pCVar4 = pCVar2;
        pCVar5 = pCVar2;
        pCVar2 = local_48;
      } while (bVar3);
      *pCVar5 = v1;
      local_40 = local_40 + (-(long)(&pCVar5[-1].field_0x0 + lVar6) >> 2);
      end._M_current = local_48;
    } while (local_40 < 9);
  }
  return bVar7;
}

Assistant:

inline bool partial_insertion_sort(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        if (begin == end) return true;
        
        std::size_t limit = 0;
        for (Iter cur = begin + 1; cur != end; ++cur) {
            Iter sift = cur;
            Iter sift_1 = cur - 1;

            // Compare first so we can avoid 2 moves for an element already positioned correctly.
            if (comp(*sift, *sift_1)) {
                T tmp = PDQSORT_PREFER_MOVE(*sift);

                do { *sift-- = PDQSORT_PREFER_MOVE(*sift_1); }
                while (sift != begin && comp(tmp, *--sift_1));

                *sift = PDQSORT_PREFER_MOVE(tmp);
                limit += cur - sift;
            }
            
            if (limit > partial_insertion_sort_limit) return false;
        }

        return true;
    }